

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<CONTACT_KEY_TOKEN>::~btAlignedObjectArray
          (btAlignedObjectArray<CONTACT_KEY_TOKEN> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}